

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<pstore::address>::
GetDescriberImpl<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::EqMatcher<pstore::address>,true>>
          (MatcherBase<pstore::address> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<address>_*,_const_EqMatcher<address>_*>_> *ppMVar1;
  MatcherBase<pstore::address> *local_28;
  tuple<const_testing::internal::MatcherBase<pstore::address>_*,_const_testing::internal::EqMatcher<pstore::address>_*>
  local_20;
  MatcherBase<pstore::address> *local_10;
  MatcherBase<pstore::address> *m_local;
  
  local_28 = m;
  local_10 = m;
  ValuePolicy<testing::internal::EqMatcher<pstore::address>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<pstore::address>const*,testing::internal::EqMatcher<pstore::address>const*>
            ((MatcherBase<pstore::address> **)&local_20,(EqMatcher<pstore::address> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<pstore::address>const*,testing::internal::EqMatcher<pstore::address>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }